

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# memory.h
# Opt level: O2

void __thiscall
kj::_::HeapDisposer<kj::(anonymous_namespace)::SocketAddress::LookupReader>::disposeImpl
          (HeapDisposer<kj::(anonymous_namespace)::SocketAddress::LookupReader> *this,void *pointer)

{
  if (pointer != (void *)0x0) {
    if (*(Thread **)((long)pointer + 8) != (Thread *)0x0) {
      Thread::detach(*(Thread **)((long)pointer + 8));
    }
    std::
    set<kj::(anonymous_namespace)::SocketAddress,_std::less<kj::(anonymous_namespace)::SocketAddress>,_std::allocator<kj::(anonymous_namespace)::SocketAddress>_>
    ::~set((set<kj::(anonymous_namespace)::SocketAddress,_std::less<kj::(anonymous_namespace)::SocketAddress>,_std::allocator<kj::(anonymous_namespace)::SocketAddress>_>
            *)((long)pointer + 0xd0));
    ArrayBuilder<kj::(anonymous_namespace)::SocketAddress>::dispose
              ((ArrayBuilder<kj::(anonymous_namespace)::SocketAddress> *)((long)pointer + 0xb0));
    Own<kj::AsyncInputStream>::dispose((Own<kj::AsyncInputStream> *)((long)pointer + 0x10));
    Own<kj::Thread>::dispose((Own<kj::Thread> *)pointer);
  }
  operator_delete(pointer,0x100);
  return;
}

Assistant:

virtual void disposeImpl(void* pointer) const override { delete reinterpret_cast<T*>(pointer); }